

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::equalsn
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,unsigned_long *str1,
          unsigned_long *str2,int len)

{
  int iVar1;
  unsigned_long uVar2;
  long lVar3;
  long lVar4;
  unsigned_long uVar5;
  bool bVar6;
  bool bVar7;
  
  uVar2 = *str1;
  bVar6 = uVar2 == 0;
  if ((bVar6) || (uVar5 = *str2, len < 1 || uVar5 == 0)) {
    iVar1 = 0;
    lVar3 = 0;
  }
  else {
    lVar4 = 0;
    do {
      if (uVar2 != uVar5) {
        return false;
      }
      lVar3 = lVar4 + 1;
      uVar2 = str1[lVar4 + 1];
      bVar6 = uVar2 == 0;
    } while (((!bVar6) && (lVar3 < len)) && (uVar5 = str2[lVar4 + 1], lVar4 = lVar3, uVar5 != 0));
    iVar1 = (int)lVar3;
  }
  bVar7 = iVar1 == len;
  if ((!bVar7) && (bVar6)) {
    bVar7 = str2[lVar3] == 0;
  }
  return bVar7;
}

Assistant:

bool equalsn(const char_type* str1, const char_type* str2, int len)
	{
		int i;
		for(i=0; str1[i] && str2[i] && i < len; ++i)
			if (str1[i] != str2[i])
				return false;

		// if one (or both) of the strings was smaller then they
		// are only equal if they have the same lenght
		return (i == len) || (str1[i] == 0 && str2[i] == 0);
	}